

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

void __thiscall
pfederc::TraitExpr::TraitExpr
          (TraitExpr *this,Lexer *lexer,Position *pos,
          unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *caps,
          Token *tokId,TemplateDecls *templs,
          vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          *impltraits,
          list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
          *functions)

{
  TemplateDecls *templs_local;
  Token *tokId_local;
  unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *caps_local;
  Position *pos_local;
  Lexer *lexer_local;
  TraitExpr *this_local;
  
  Expr::Expr(&this->super_Expr,lexer,EXPR_TRAIT,pos);
  Capable::Capable(&this->super_Capable,caps);
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__TraitExpr_0017f808;
  this->tokId = tokId;
  std::
  vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  ::vector(&this->templs,templs);
  std::
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ::vector(&this->impltraits,impltraits);
  std::__cxx11::
  list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
  ::list(&this->functions,functions);
  if (this->tokId != (Token *)0x0) {
    _setTemplateParents(&this->templs,&this->super_Expr);
    _setParents<pfederc::Expr>(&this->impltraits,&this->super_Expr);
    _setParents<pfederc::FuncExpr>(&this->functions,&this->super_Expr);
    return;
  }
  __assert_fail("this->tokId",
                "/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/expr.cpp"
                ,0x14f,
                "pfederc::TraitExpr::TraitExpr(const Lexer &, const Position &, std::unique_ptr<Capabilities> &&, const Token *, TemplateDecls &&, std::vector<std::unique_ptr<Expr>> &&, std::list<std::unique_ptr<FuncExpr>> &&)"
               );
}

Assistant:

TraitExpr::TraitExpr(const Lexer &lexer, const Position &pos,
    std::unique_ptr<Capabilities> &&caps,
    const Token *tokId,
    TemplateDecls &&templs,
    std::vector<std::unique_ptr<Expr>> &&impltraits,
    std::list<std::unique_ptr<FuncExpr>> &&functions) noexcept
    : Expr(lexer, ExprType::EXPR_TRAIT, pos), Capable(std::move(caps)), tokId{tokId},
      templs(std::move(templs)),
      impltraits(std::move(impltraits)), functions(std::move(functions)) {
  assert(this->tokId);

  _setTemplateParents(this->templs, this);
  _setParents(this->impltraits, this);
  _setParents(this->functions, this);
}